

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void PathBezierQuadraticCurveToCasteljau
               (ImVector<ImVec2> *path,float x1,float y1,float x2,float y2,float x3,float y3,
               float tess_tol,int level)

{
  float in_ESI;
  ImVector<ImVec2> *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  float in_XMM6_Da;
  float y123;
  float x123;
  float y23;
  float x23;
  float y12;
  float x12;
  float det;
  float dy;
  float dx;
  ImVec2 *in_stack_ffffffffffffff98;
  ImVec2 local_3c;
  float local_34;
  float level_00;
  float tess_tol_00;
  
  tess_tol_00 = in_XMM4_Da - in_XMM0_Da;
  level_00 = in_XMM5_Da - in_XMM1_Da;
  local_34 = (in_XMM2_Da - in_XMM4_Da) * level_00 + -((in_XMM3_Da - in_XMM5_Da) * tess_tol_00);
  if (in_XMM6_Da * (tess_tol_00 * tess_tol_00 + level_00 * level_00) <= local_34 * local_34 * 4.0) {
    if ((int)in_ESI < 10) {
      PathBezierQuadraticCurveToCasteljau
                ((ImVector<ImVec2> *)CONCAT44(in_XMM0_Da,in_XMM1_Da),in_XMM2_Da,in_XMM3_Da,
                 in_XMM4_Da,in_XMM5_Da,in_XMM6_Da,in_ESI,tess_tol_00,(int)level_00);
      PathBezierQuadraticCurveToCasteljau
                ((ImVector<ImVec2> *)CONCAT44(in_XMM0_Da,in_XMM1_Da),in_XMM2_Da,in_XMM3_Da,
                 in_XMM4_Da,in_XMM5_Da,in_XMM6_Da,in_ESI,tess_tol_00,(int)level_00);
    }
  }
  else {
    ImVec2::ImVec2(&local_3c,in_XMM4_Da,in_XMM5_Da);
    ImVector<ImVec2>::push_back(in_RDI,in_stack_ffffffffffffff98);
  }
  return;
}

Assistant:

static void PathBezierQuadraticCurveToCasteljau(ImVector<ImVec2>* path, float x1, float y1, float x2, float y2, float x3, float y3, float tess_tol, int level)
{
    float dx = x3 - x1, dy = y3 - y1;
    float det = (x2 - x3) * dy - (y2 - y3) * dx;
    if (det * det * 4.0f < tess_tol * (dx * dx + dy * dy))
    {
        path->push_back(ImVec2(x3, y3));
    }
    else if (level < 10)
    {
        float x12 = (x1 + x2) * 0.5f, y12 = (y1 + y2) * 0.5f;
        float x23 = (x2 + x3) * 0.5f, y23 = (y2 + y3) * 0.5f;
        float x123 = (x12 + x23) * 0.5f, y123 = (y12 + y23) * 0.5f;
        PathBezierQuadraticCurveToCasteljau(path, x1, y1, x12, y12, x123, y123, tess_tol, level + 1);
        PathBezierQuadraticCurveToCasteljau(path, x123, y123, x23, y23, x3, y3, tess_tol, level + 1);
    }
}